

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.tab.cpp
# Opt level: O0

int yysyntax_error(long *yymsg_alloc,char **yymsg,yypcontext_t *yyctx)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *yyres;
  undefined8 *in_RSI;
  long *in_RDI;
  int yyi_1;
  char *yyp;
  long yysize1;
  int yyi;
  int yycount;
  long yysize;
  yysymbol_kind_t yyarg [5];
  char *yyformat;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar5;
  yypcontext_t *in_stack_ffffffffffffff98;
  int local_58;
  long local_50;
  char *local_28;
  int local_4;
  
  iVar2 = yy_syntax_error_arguments
                    (in_stack_ffffffffffffff98,
                     (yysymbol_kind_t *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  if (iVar2 == -2) {
    local_4 = -2;
  }
  else {
    switch(iVar2) {
    default:
      local_28 = "syntax error";
      break;
    case 1:
      local_28 = "syntax error, unexpected %s";
      break;
    case 2:
      local_28 = "syntax error, unexpected %s, expecting %s";
      break;
    case 3:
      local_28 = "syntax error, unexpected %s, expecting %s or %s";
      break;
    case 4:
      local_28 = "syntax error, unexpected %s, expecting %s or %s or %s";
      break;
    case 5:
      local_28 = "syntax error, unexpected %s, expecting %s or %s or %s or %s";
    }
    sVar3 = strlen(local_28);
    local_50 = (sVar3 - (long)(iVar2 << 1)) + 1;
    for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
      lVar4 = yytnamerr((char *)in_stack_ffffffffffffff98,
                        (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (local_50 + lVar4 < local_50) {
        return -2;
      }
      local_50 = local_50 + lVar4;
    }
    if (*in_RDI < local_50) {
      *in_RDI = local_50 << 1;
      if ((*in_RDI < local_50) || (0x7fffffffffffffff < *in_RDI)) {
        *in_RDI = 0x7fffffffffffffff;
      }
      local_4 = -1;
    }
    else {
      yyres = (char *)*in_RSI;
      iVar5 = 0;
      while (cVar1 = *local_28, *yyres = cVar1, cVar1 != '\0') {
        if (((*yyres == '%') && (local_28[1] == 's')) && (iVar5 < iVar2)) {
          iVar5 = iVar5 + 1;
          lVar4 = yytnamerr(yyres,(char *)CONCAT44(iVar5,in_stack_ffffffffffffff90));
          yyres = yyres + lVar4;
          local_28 = local_28 + 2;
        }
        else {
          yyres = yyres + 1;
          local_28 = local_28 + 1;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
yysyntax_error (YYPTRDIFF_T *yymsg_alloc, char **yymsg,
                const yypcontext_t *yyctx)
{
  enum { YYARGS_MAX = 5 };
  /* Internationalized format string. */
  const char *yyformat = YY_NULLPTR;
  /* Arguments of yyformat: reported tokens (one for the "unexpected",
     one per "expected"). */
  yysymbol_kind_t yyarg[YYARGS_MAX];
  /* Cumulated lengths of YYARG.  */
  YYPTRDIFF_T yysize = 0;

  /* Actual size of YYARG. */
  int yycount = yy_syntax_error_arguments (yyctx, yyarg, YYARGS_MAX);
  if (yycount == YYENOMEM)
    return YYENOMEM;

  switch (yycount)
    {
#define YYCASE_(N, S)                       \
      case N:                               \
        yyformat = S;                       \
        break
    default: /* Avoid compiler warnings. */
      YYCASE_(0, YY_("syntax error"));
      YYCASE_(1, YY_("syntax error, unexpected %s"));
      YYCASE_(2, YY_("syntax error, unexpected %s, expecting %s"));
      YYCASE_(3, YY_("syntax error, unexpected %s, expecting %s or %s"));
      YYCASE_(4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
      YYCASE_(5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
    }

  /* Compute error message size.  Don't count the "%s"s, but reserve
     room for the terminator.  */
  yysize = yystrlen (yyformat) - 2 * yycount + 1;
  {
    int yyi;
    for (yyi = 0; yyi < yycount; ++yyi)
      {
        YYPTRDIFF_T yysize1
          = yysize + yytnamerr (YY_NULLPTR, yytname[yyarg[yyi]]);
        if (yysize <= yysize1 && yysize1 <= YYSTACK_ALLOC_MAXIMUM)
          yysize = yysize1;
        else
          return YYENOMEM;
      }
  }

  if (*yymsg_alloc < yysize)
    {
      *yymsg_alloc = 2 * yysize;
      if (! (yysize <= *yymsg_alloc
             && *yymsg_alloc <= YYSTACK_ALLOC_MAXIMUM))
        *yymsg_alloc = YYSTACK_ALLOC_MAXIMUM;
      return -1;
    }

  /* Avoid sprintf, as that infringes on the user's name space.
     Don't have undefined behavior even if the translation
     produced a string with the wrong number of "%s"s.  */
  {
    char *yyp = *yymsg;
    int yyi = 0;
    while ((*yyp = *yyformat) != '\0')
      if (*yyp == '%' && yyformat[1] == 's' && yyi < yycount)
        {
          yyp += yytnamerr (yyp, yytname[yyarg[yyi++]]);
          yyformat += 2;
        }
      else
        {
          ++yyp;
          ++yyformat;
        }
  }
  return 0;
}